

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QuadHeap.cpp
# Opt level: O1

void __thiscall QuadHeap::QuadHeap(QuadHeap *this)

{
  *(undefined ***)&this->super_Entity = &PTR__Coordinated_001306f8;
  Entity::Entity(&this->super_Entity,&PTR_PTR_00130460,Vec2d::ORIGIN,Vec2d::ORIGIN);
  *(undefined ***)&this->super_Entity = &PTR__QuadHeap_00130340;
  this->super_Drawable = (Drawable)&PTR__QuadHeap_001303f0;
  (this->super_Collidable)._vptr_Collidable = (_func_int **)&PTR_collidesWithQuads_00130448;
  memset(&this->quads,0,0xe0);
  return;
}

Assistant:

QuadHeap::QuadHeap(): Entity(Vec2d::ORIGIN, Vec2d::ORIGIN) {
    quads = vector<Quad*>();
    
    for (int x=0; x<10; x++) {
        for (int y=0; y<20; y++) {
            quadState[x][y] = false;
        }
    }
}